

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

void Sto_ManDumpClauses(Sto_Man_t *p,char *pFileName)

{
  uint uVar1;
  FILE *__stream;
  int local_2c;
  Sto_Cls_t *pSStack_28;
  int i;
  Sto_Cls_t *pClause;
  FILE *pFile;
  char *pFileName_local;
  Sto_Man_t *p_local;
  
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    printf("Error: Cannot open output file (%s).\n",pFileName);
  }
  else {
    fprintf(__stream,"p %d %d %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses,
            (ulong)(uint)p->nRoots,(ulong)(uint)p->nClausesA);
    for (pSStack_28 = p->pHead; pSStack_28 != (Sto_Cls_t *)0x0; pSStack_28 = pSStack_28->pNext) {
      for (local_2c = 0; local_2c < (int)(*(uint *)&pSStack_28->field_0x1c >> 3 & 0xffffff);
          local_2c = local_2c + 1) {
        uVar1 = lit_print(*(lit *)((long)&pSStack_28[1].pNext + (long)local_2c * 4));
        fprintf(__stream," %d",(ulong)uVar1);
      }
      fprintf(__stream," 0\n");
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Sto_ManDumpClauses( Sto_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Sto_Cls_t * pClause;
    int i;
    // start the file
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Error: Cannot open output file (%s).\n", pFileName );
        return;
    }
    // write the data
    fprintf( pFile, "p %d %d %d %d\n", p->nVars, p->nClauses, p->nRoots, p->nClausesA );
    Sto_ManForEachClause( p, pClause )
    {
        for ( i = 0; i < (int)pClause->nLits; i++ )
            fprintf( pFile, " %d", lit_print(pClause->pLits[i]) );
        fprintf( pFile, " 0\n" );
    }
//    fprintf( pFile, " 0\n" );
    fclose( pFile );
}